

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  int iVar1;
  long lVar2;
  string *name;
  char nMatches [2];
  _List_iterator<cmDefinitions> local_60;
  long local_58;
  _List_node_base local_50;
  StackIter local_40;
  StackIter local_38;
  
  lVar2 = -10;
  name = matchVariables_abi_cxx11_;
  iVar1 = 0;
  do {
    local_60._M_node = &local_50;
    if (re->endp[lVar2] == (char *)0x0) {
      local_58 = 0;
      local_50._M_next._0_1_ = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,re->endp[lVar2],re->endp[lVar2 + 10]);
    }
    if (local_58 != 0) {
      AddDefinition(this,name,(char *)local_60._M_node);
      local_38.current._M_node = (_List_iterator<cmDefinitions>)(this->Internal).x_;
      local_40.current._M_node =
           (_List_iterator<cmDefinitions>)
           (((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)
            &((_List_node_base *)local_38.current._M_node)->_M_next)->
           super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>)._M_impl._M_node.
           super__List_node_base._M_next;
      cmDefinitions::Get(name,&local_38,&local_40);
      iVar1 = (int)lVar2 + 0x3a;
    }
    if (local_60._M_node != &local_50) {
      operator_delete(local_60._M_node,CONCAT71(local_50._M_next._1_7_,local_50._M_next._0_1_) + 1);
    }
    name = name + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  local_40.current._M_node._0_2_ = (ushort)(byte)iVar1;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,(char *)&local_40);
  local_60._M_node = (_List_node_base *)(this->Internal).x_;
  local_38.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((Internals *)local_60._M_node)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&nMatchesVariable_abi_cxx11_,(StackIter *)&local_60,&local_38);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i=0; i<10; i++)
    {
    std::string const& m = re.match(i);
    if(!m.empty())
      {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
      }
    }
  char nMatches[] = {highest, '\0'};
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}